

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O1

int mk_sched_init(mk_server *server)

{
  short sVar1;
  uint uVar2;
  size_t __size;
  undefined8 *__ptr;
  void *__s;
  uint *puVar3;
  char *pcVar4;
  char buf [128];
  char local_a8 [128];
  
  __ptr = (undefined8 *)calloc(1,8);
  if (__ptr == (undefined8 *)0x0) {
    puVar3 = (uint *)__errno_location();
    uVar2 = *puVar3;
    pcVar4 = strerror_r(uVar2,local_a8,0x80);
    if (pcVar4 != (char *)0x0) {
      mk_print(0x1001,"strerror_r() failed");
    }
    mk_print(0x1001,"%s: %s, errno=%i at %s:%i","malloc",local_a8,(ulong)uVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
             ,0x1da);
  }
  else {
    sVar1 = server->workers;
    __size = (long)sVar1 * 0xa0;
    __s = malloc(__size);
    if (__s == (void *)0x0 && (long)sVar1 != 0) {
      perror("malloc");
    }
    *__ptr = __s;
    if (__s != (void *)0x0) {
      memset(__s,0,__size);
      pthread_mutex_init((pthread_mutex_t *)&server->pth_mutex,(pthread_mutexattr_t *)0x0);
      pthread_cond_init((pthread_cond_t *)&server->pth_cond,(pthread_condattr_t *)0x0);
      server->pth_init = 0;
      server->sched_ctx = __ptr;
      return 0;
    }
    puVar3 = (uint *)__errno_location();
    uVar2 = *puVar3;
    pcVar4 = strerror_r(uVar2,local_a8,0x80);
    if (pcVar4 != (char *)0x0) {
      mk_print(0x1001,"strerror_r() failed");
    }
    mk_print(0x1001,"%s: %s, errno=%i at %s:%i","malloc",local_a8,(ulong)uVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
             ,0x1e1);
    free(__ptr);
  }
  return -1;
}

Assistant:

int mk_sched_init(struct mk_server *server)
{
    int size;
    struct mk_sched_ctx *ctx;

    ctx = mk_mem_alloc_z(sizeof(struct mk_sched_ctx));
    if (!ctx) {
        mk_libc_error("malloc");
        return -1;
    }

    size = (sizeof(struct mk_sched_worker) * server->workers);
    ctx->workers = mk_mem_alloc(size);
    if (!ctx->workers) {
        mk_libc_error("malloc");
        mk_mem_free(ctx);
        return -1;
    }
    memset(ctx->workers, '\0', size);

    /* Initialize helpers */
    pthread_mutex_init(&server->pth_mutex, NULL);
    pthread_cond_init(&server->pth_cond, NULL);
    server->pth_init = MK_FALSE;

    /* Map context into server context */
    server->sched_ctx = ctx;

    /* The mk_thread_prepare call was replaced by mk_http_thread_initialize_tls
     * which is called earlier.
     */

    return 0;
}